

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  int32_t offsetS;
  int32_t offsetM;
  int32_t local_54;
  int32_t tmpS;
  int32_t tmpM;
  int32_t tmpH;
  int32_t offsetH;
  int32_t *local_40;
  UnicodeString *local_38;
  
  *parsedLen = 0;
  offsetS = 0;
  offsetM = 0;
  offsetH = 0;
  uVar4 = 1;
  puVar5 = &PARSE_GMT_OFFSET_TYPES;
  lVar6 = 0;
  local_54 = start;
  local_40 = parsedLen;
  local_38 = text;
  do {
    iVar1 = parseOffsetFieldsWithPattern
                      (this,local_38,local_54,this->fGMTOffsetPatternItems[*puVar5],'\0',&offsetH,
                       &offsetM,&offsetS);
    if (0 < iVar1) {
      uVar4 = 1;
      if (((int)lVar6 != 2) && ((int)lVar6 != 4)) {
        uVar4 = -(uint)(lVar6 != 0) | 1;
      }
    }
    if (0 < iVar1) break;
    puVar5 = puVar5 + 1;
    bVar8 = lVar6 != 5;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  if ((0 < iVar1) && (this->fAbuttingOffsetHoursAndMinutes != '\0')) {
    tmpH = 0;
    tmpM = 0;
    tmpS = 0;
    uVar7 = 1;
    puVar5 = &PARSE_GMT_OFFSET_TYPES;
    lVar6 = 0;
    do {
      iVar2 = parseOffsetFieldsWithPattern
                        (this,local_38,local_54,this->fGMTOffsetPatternItems[*puVar5],'\x01',&tmpH,
                         &tmpM,&tmpS);
      if (0 < iVar2) {
        uVar7 = 1;
        if (((int)lVar6 != 2) && ((int)lVar6 != 4)) {
          uVar7 = -(uint)(lVar6 != 0) | 1;
        }
      }
      if (0 < iVar2) break;
      puVar5 = puVar5 + 1;
      bVar8 = lVar6 != 5;
      lVar6 = lVar6 + 1;
    } while (bVar8);
    if (iVar1 < iVar2) {
      offsetH = tmpH;
      offsetM = tmpM;
      offsetS = tmpS;
      iVar1 = iVar2;
      uVar4 = uVar7;
    }
  }
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = uVar4 * ((offsetH * 0x3c + offsetM) * 0x3c + offsetS) * 1000;
    *local_40 = iVar1;
  }
  return iVar3;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFields(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t outLen = 0;
    int32_t offset = 0;
    int32_t sign = 1;

    parsedLen = 0;

    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;

    for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
        int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
        UVector* items = fGMTOffsetPatternItems[gmtPatType];
        U_ASSERT(items != NULL);

        outLen = parseOffsetFieldsWithPattern(text, start, items, FALSE, offsetH, offsetM, offsetS);
        if (outLen > 0) {
            sign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                1 : -1;
            break;
        }
    }

    if (outLen > 0 && fAbuttingOffsetHoursAndMinutes) {
        // When hours field is sabutting minutes field,
        // the parse result above may not be appropriate.
        // For example, "01020" is parsed as 01:02: above,
        // but it should be parsed as 00:10:20.
        int32_t tmpLen = 0;
        int32_t tmpSign = 1;
        int32_t tmpH = 0;
        int32_t tmpM = 0;
        int32_t tmpS = 0;

        for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
            int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
            UVector* items = fGMTOffsetPatternItems[gmtPatType];
            U_ASSERT(items != NULL);

            // forcing parse to use single hour digit
            tmpLen = parseOffsetFieldsWithPattern(text, start, items, TRUE, tmpH, tmpM, tmpS);
            if (tmpLen > 0) {
                tmpSign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                    1 : -1;
                break;
            }
        }
        if (tmpLen > outLen) {
            // Better parse result with single hour digit
            outLen = tmpLen;
            sign = tmpSign;
            offsetH = tmpH;
            offsetM = tmpM;
            offsetS = tmpS;
        }
    }

    if (outLen > 0) {
        offset = ((((offsetH * 60) + offsetM) * 60) + offsetS) * 1000 * sign;
        parsedLen = outLen;
    }

    return offset;
}